

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_file_system.cpp
# Opt level: O3

void duckdb::GlobFilesInternal
               (FileSystem *fs,string *path,string *glob,bool match_directory,
               vector<duckdb::OpenFileInfo,_true> *result,bool join_path)

{
  undefined1 local_52;
  undefined1 local_51;
  long *local_50;
  undefined8 local_48;
  code *local_40;
  code *local_38;
  
  local_48 = 0;
  local_52 = join_path;
  local_51 = match_directory;
  local_50 = (long *)operator_new(0x30);
  *local_50 = (long)&local_51;
  local_50[1] = (long)glob;
  local_50[2] = (long)&local_52;
  local_50[3] = (long)result;
  local_50[4] = (long)fs;
  local_50[5] = (long)path;
  local_38 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/common/local_file_system.cpp:1272:21)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/common/local_file_system.cpp:1272:21)>
             ::_M_manager;
  (*fs->_vptr_FileSystem[0x10])(fs,path,&local_50,0);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,3);
  }
  return;
}

Assistant:

static void GlobFilesInternal(FileSystem &fs, const string &path, const string &glob, bool match_directory,
                              vector<OpenFileInfo> &result, bool join_path) {
	fs.ListFiles(path, [&](const string &fname, bool is_directory) {
		if (is_directory != match_directory) {
			return;
		}
		if (Glob(fname.c_str(), fname.size(), glob.c_str(), glob.size())) {
			if (join_path) {
				result.push_back(fs.JoinPath(path, fname));
			} else {
				result.push_back(fname);
			}
		}
	});
}